

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall
FIX::double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  uint64_t uVar1;
  uint uVar2;
  int in_R8D;
  ulong uVar3;
  uint from;
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  
  Zero(this);
  uVar3 = 0;
  uVar2 = value.length_;
  for (from = uVar2; 0x12 < (int)from; from = from - 0x13) {
    buffer.start_ = (char *)(ulong)uVar2;
    buffer._8_8_ = uVar3;
    uVar1 = ReadUInt64((double_conversion *)value.start_,buffer,0x13,in_R8D);
    uVar3 = (ulong)((int)uVar3 + 0x13);
    MultiplyByPowerOfTen(this,0x13);
    AddUInt64(this,uVar1);
  }
  buffer_00.start_ = (char *)(ulong)uVar2;
  buffer_00._8_8_ = uVar3;
  uVar1 = ReadUInt64((double_conversion *)value.start_,buffer_00,from,in_R8D);
  MultiplyByPowerOfTen(this,from);
  AddUInt64(this,uVar1);
  Clamp(this);
  return;
}

Assistant:

void Bignum::AssignDecimalString(Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  int pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}